

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

btScalar gjkepa2_impl::GJK::projectorigin
                   (btVector3 *a,btVector3 *b,btVector3 *c,btVector3 *d,btScalar *w,U *m)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  btVector3 *b_00;
  btVector3 *a_00;
  btVector3 *b_01;
  long lVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  btScalar bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  U subm;
  btScalar subw [3];
  btVector3 dl [3];
  btVector3 *vt [4];
  U local_e0;
  float local_dc;
  btScalar local_d8 [4];
  undefined1 local_c8 [4];
  float afStack_c4 [3];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  U *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  btVector3 *local_70;
  btVector3 *local_68;
  btVector3 *local_60;
  btVector3 *local_58 [5];
  
  local_90 = m;
  local_58[0] = a;
  local_58[1] = b;
  local_58[2] = c;
  local_58[3] = d;
  fVar10 = (float)*(undefined8 *)d->m_floats;
  fVar21 = (float)((ulong)*(undefined8 *)d->m_floats >> 0x20);
  fVar12 = (float)*(undefined8 *)a->m_floats;
  fVar13 = (float)((ulong)*(undefined8 *)a->m_floats >> 0x20);
  fVar9 = fVar12 - fVar10;
  fVar11 = fVar13 - fVar21;
  fVar1 = a->m_floats[2];
  fVar25 = d->m_floats[2];
  fVar14 = fVar1 - fVar25;
  unique0x10000028 = fVar11;
  local_c8 = fVar9;
  unique0x1000002c = fVar14;
  unique0x10000030 = 0;
  fVar15 = (float)*(undefined8 *)b->m_floats;
  fVar16 = (float)((ulong)*(undefined8 *)b->m_floats >> 0x20);
  fVar17 = fVar15 - fVar10;
  fVar19 = fVar16 - fVar21;
  fVar2 = b->m_floats[2];
  fVar22 = fVar2 - fVar25;
  local_b8._4_4_ = fVar19;
  local_b8._0_4_ = fVar17;
  local_b8._8_4_ = fVar22;
  local_b8._12_4_ = 0;
  fVar23 = (float)*(undefined8 *)c->m_floats;
  fVar24 = (float)((ulong)*(undefined8 *)c->m_floats >> 0x20);
  fVar18 = fVar15 - fVar23;
  fVar20 = fVar16 - fVar24;
  fVar23 = fVar23 - fVar10;
  fVar24 = fVar24 - fVar21;
  fVar10 = fVar2 - c->m_floats[2];
  fVar25 = c->m_floats[2] - fVar25;
  local_a8._4_4_ = fVar24;
  local_a8._0_4_ = fVar23;
  local_a8._8_4_ = fVar25;
  local_a8._12_4_ = 0;
  fVar25 = fVar23 * -fVar14 * fVar19 +
           fVar25 * fVar9 * fVar19 +
           (((fVar11 * fVar22 * fVar23 + fVar14 * fVar17 * fVar24) - fVar22 * fVar9 * fVar24) -
           fVar17 * fVar11 * fVar25);
  fVar9 = -1.0;
  if ((fVar25 != 0.0) &&
     ((((fVar13 - fVar16) * fVar18 - (fVar12 - fVar15) * fVar20) * fVar1 +
      (fVar20 * (fVar1 - fVar2) - (fVar13 - fVar16) * fVar10) * fVar12 +
      (fVar10 * (fVar12 - fVar15) - (fVar1 - fVar2) * fVar18) * fVar13) * fVar25 <= 0.0)) {
    local_70 = c;
    local_68 = b;
    local_60 = a;
    lVar6 = 0;
    local_d8[2] = 0.0;
    local_d8[0] = 0.0;
    local_d8[1] = 0.0;
    local_e0 = 0;
    fVar9 = -1.0;
    bVar7 = 0;
    local_88 = fVar25;
    fStack_84 = fVar25;
    fStack_80 = fVar25;
    fStack_7c = fVar25;
    do {
      uVar3 = *(uint *)((long)projectorigin::imd3 + lVar6);
      uVar5 = (ulong)uVar3;
      lVar4 = uVar5 * 0x10;
      if (0.0 < ((*(float *)(local_c8 + lVar6 * 4) * *(float *)(local_c8 + lVar4 + 4) -
                 *(float *)(local_c8 + lVar4) * *(float *)(local_c8 + lVar6 * 4 + 4)) *
                 d->m_floats[2] +
                (*(float *)(local_c8 + lVar6 * 4 + 4) * *(float *)(local_c8 + lVar4 + 8) -
                *(float *)(local_c8 + lVar4 + 4) * *(float *)(local_c8 + lVar6 * 4 + 8)) *
                d->m_floats[0] +
                (*(float *)(local_c8 + lVar6 * 4 + 8) * *(float *)(local_c8 + lVar4) -
                *(float *)(local_c8 + lVar4 + 8) * *(float *)(local_c8 + lVar6 * 4)) *
                d->m_floats[1]) * fVar25) {
        local_dc = fVar9;
        bVar8 = projectorigin(*(btVector3 **)((long)local_58 + lVar6 * 2),local_58[uVar5],d,local_d8
                              ,&local_e0);
        fVar25 = local_88;
        if ((local_dc < 0.0) || (fVar9 = local_dc, bVar8 < local_dc)) {
          *local_90 = (1 << ((byte)uVar3 & 0x1f) & (int)(local_e0 << 0x1e) >> 0x1f) +
                      (local_e0 & 4) * 2 + (1 << (bVar7 & 0x1f) & -(local_e0 & 1));
          *(btScalar *)((long)w + lVar6) = local_d8[0];
          w[uVar5] = local_d8[1];
          w[projectorigin::imd3[uVar5]] = 0.0;
          w[3] = local_d8[2];
          fVar9 = bVar8;
        }
      }
      a_00 = local_68;
      b_00 = local_70;
      bVar7 = bVar7 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xc);
    if (fVar9 < 0.0) {
      *local_90 = 0xf;
      bVar8 = det(local_70,local_68,d);
      b_01 = local_60;
      *w = bVar8 / local_88;
      bVar8 = det(local_60,b_00,d);
      w[1] = bVar8 / local_88;
      bVar8 = det(a_00,b_01,d);
      w[2] = bVar8 / local_88;
      w[3] = 1.0 - (*w + w[1] + bVar8 / local_88);
      fVar9 = 0.0;
    }
  }
  return fVar9;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				const btVector3& d,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c,&d};
				const btVector3		dl[]={a-d,b-d,c-d};
				const btScalar		vl=det(dl[0],dl[1],dl[2]);
				const bool			ng=(vl*btDot(a,btCross(b-c,a-b)))<=0;
				if(ng&&(btFabs(vl)>GJK_SIMPLEX4_EPS))
				{
					btScalar	mindist=-1;
					btScalar	subw[3]={0.f,0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						const U			j=imd3[i];
						const btScalar	s=vl*btDot(d,btCross(dl[i],dl[j]));
						if(s>0)
						{
							const btScalar	subd=projectorigin(*vt[i],*vt[j],d,subw,subm);
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>((subm&1?1<<i:0)+
									(subm&2?1<<j:0)+
									(subm&4?8:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;
								w[3]		=	subw[2];
							}
						}
					}
					if(mindist<0)
					{
						mindist	=	0;
						m		=	15;
						w[0]	=	det(c,b,d)/vl;
						w[1]	=	det(a,c,d)/vl;
						w[2]	=	det(b,a,d)/vl;
						w[3]	=	1-(w[0]+w[1]+w[2]);
					}
					return(mindist);
				}
				return(-1);
			}